

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

ggml_tensor * apply_conv2d(ggml_context *ctx,ggml_tensor *input,conv2d_layer *layer)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ggml_tensor *result;
  ggml_tensor *local_20;
  
  local_20 = (ggml_tensor *)
             ggml_conv_2d(in_RDI,*in_RDX,in_RSI,1,1,*(undefined4 *)(in_RDX + 5),
                          *(undefined4 *)(in_RDX + 5),1,1);
  if ((*(byte *)((long)in_RDX + 0x2c) & 1) != 0) {
    uVar1 = ggml_repeat(in_RDI,in_RDX[3],local_20);
    uVar1 = ggml_sub(in_RDI,local_20,uVar1);
    uVar2 = ggml_repeat(in_RDI,in_RDX[4],uVar1);
    uVar2 = ggml_sqrt(in_RDI,uVar2);
    uVar1 = ggml_div(in_RDI,uVar1,uVar2);
    uVar2 = ggml_repeat(in_RDI,in_RDX[2],uVar1);
    local_20 = (ggml_tensor *)ggml_mul(in_RDI,uVar1,uVar2);
  }
  uVar1 = ggml_repeat(in_RDI,in_RDX[1],local_20);
  local_20 = (ggml_tensor *)ggml_add(in_RDI,local_20,uVar1);
  if ((*(byte *)((long)in_RDX + 0x2d) & 1) != 0) {
    local_20 = (ggml_tensor *)ggml_leaky_relu(0x3dcccccd,in_RDI,local_20,1);
  }
  return local_20;
}

Assistant:

static ggml_tensor * apply_conv2d(ggml_context * ctx, ggml_tensor * input, const conv2d_layer & layer)
{
    struct ggml_tensor * result = ggml_conv_2d(ctx, layer.weights, input, 1, 1, layer.padding, layer.padding, 1, 1);
    if (layer.batch_normalize) {
        result = ggml_sub(ctx, result, ggml_repeat(ctx, layer.rolling_mean, result));
        result = ggml_div(ctx, result, ggml_sqrt(ctx, ggml_repeat(ctx, layer.rolling_variance, result)));
        result = ggml_mul(ctx, result, ggml_repeat(ctx, layer.scales, result));
    }
    result = ggml_add(ctx, result, ggml_repeat(ctx, layer.biases, result));
    if (layer.activate) {
        result = ggml_leaky_relu(ctx, result, 0.1f, true);
    }
    return result;
}